

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elu_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::ELU_x86_avx::forward_inplace(ELU_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [24];
  long *in_RSI;
  long *in_RDI;
  float fVar30;
  double dVar31;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  undefined1 auVar32 [32];
  float fVar34;
  float fVar40;
  undefined1 auVar33 [32];
  __m128 _p_1;
  __m128 _alpha128;
  __m256 _p;
  __m256 _alpha256;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int h;
  int w;
  Mat *m;
  __m256 neg;
  __m256 pos;
  __m128 neg_1;
  __m128 pos_1;
  __m256 pow2n;
  __m256 y;
  __m256 mask;
  __m256 one;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i y2;
  __m128i y1;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  __m256i ret_1;
  __m128i x2_1;
  __m128i x1_1;
  v4sf pow2n_1;
  v4sf y_1;
  v4sf mask_1;
  v4sf one_1;
  v4si emm0;
  v4sf fx_1;
  v4sf tmp_1;
  int local_18d8;
  undefined8 local_18c8;
  undefined8 local_18c0;
  undefined8 local_18b8;
  undefined4 local_18b0;
  long local_18a8;
  undefined4 local_18a0;
  undefined4 local_189c;
  undefined4 local_1898;
  undefined4 local_1894;
  undefined4 local_1890;
  undefined8 local_1888;
  undefined1 (*local_1880) [32];
  int local_1878;
  int local_1874;
  int local_1870;
  int local_186c;
  int local_1868;
  int local_1864;
  long *local_1858;
  undefined1 local_1845;
  int local_1844;
  undefined8 *local_1838;
  undefined8 *local_1830;
  undefined8 *local_1820;
  uint local_180c;
  undefined1 (*local_1808) [32];
  float local_1800;
  float fStack_17fc;
  float fStack_17f8;
  float fStack_17f4;
  float fStack_17f0;
  float fStack_17ec;
  float fStack_17e8;
  float fStack_17e4;
  undefined1 (*local_17c8) [32];
  undefined1 local_17c0 [32];
  undefined1 local_17a0 [32];
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined4 local_1734;
  float local_1730;
  float fStack_172c;
  float fStack_1728;
  float fStack_1724;
  float local_171c;
  undefined1 (*local_1718) [32];
  float local_1710;
  float fStack_170c;
  float fStack_1708;
  float fStack_1704;
  undefined1 (*local_16f8) [32];
  undefined1 local_16f0 [16];
  undefined1 local_16e0 [16];
  undefined8 local_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined4 local_16b0;
  undefined4 uStack_16ac;
  undefined4 uStack_16a8;
  undefined4 uStack_16a4;
  undefined4 local_1694;
  long local_1690;
  undefined4 local_1684;
  long local_1680;
  undefined1 (*local_1678) [32];
  undefined4 local_166c;
  int local_1668;
  int local_1664;
  undefined8 *local_1660;
  undefined4 local_1654;
  long local_1650;
  undefined8 *local_1630;
  undefined1 local_1600 [32];
  undefined4 local_15e0;
  undefined4 local_15dc;
  undefined4 local_15d8;
  undefined4 local_15d4;
  undefined4 local_15d0;
  undefined4 local_15cc;
  undefined4 local_15c8;
  undefined4 local_15c4;
  undefined1 local_15c0 [32];
  uint local_15a0;
  uint local_159c;
  uint local_1598;
  uint local_1594;
  uint local_1590;
  uint local_158c;
  uint local_1588;
  uint local_1584;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  ulong uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  ulong uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined1 local_1440 [32];
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined1 local_13e0 [8];
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined1 local_13a0 [32];
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined1 local_1340 [32];
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  float local_1260;
  float fStack_125c;
  float fStack_1258;
  float fStack_1254;
  float fStack_1250;
  float fStack_124c;
  float fStack_1248;
  float fStack_1244;
  undefined1 local_1240 [8];
  float fStack_1238;
  float fStack_1234;
  float fStack_1230;
  float fStack_122c;
  float fStack_1228;
  float fStack_1224;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  float local_10e0;
  float fStack_10dc;
  float fStack_10d8;
  float fStack_10d4;
  float fStack_10d0;
  float fStack_10cc;
  float fStack_10c8;
  float fStack_10c4;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  float local_1000;
  float fStack_ffc;
  float fStack_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float fStack_fe8;
  float fStack_fe4;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  float local_f20;
  float fStack_f1c;
  float fStack_f18;
  float fStack_f14;
  float fStack_f10;
  float fStack_f0c;
  float fStack_f08;
  float fStack_f04;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  float local_e40;
  float fStack_e3c;
  float fStack_e38;
  float fStack_e34;
  float fStack_e30;
  float fStack_e2c;
  float fStack_e28;
  float fStack_e24;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  float local_d60;
  float fStack_d5c;
  float fStack_d58;
  float fStack_d54;
  float fStack_d50;
  float fStack_d4c;
  float fStack_d48;
  float fStack_d44;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  float local_c80;
  float fStack_c7c;
  float fStack_c78;
  float fStack_c74;
  float fStack_c70;
  float fStack_c6c;
  float fStack_c68;
  float fStack_c64;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  float local_ba0;
  float fStack_b9c;
  float fStack_b98;
  float fStack_b94;
  float fStack_b90;
  float fStack_b8c;
  float fStack_b88;
  undefined4 uStack_b84;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  float fStack_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  float local_9c0;
  float fStack_9bc;
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined1 local_880 [16];
  undefined1 local_870 [16];
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined1 local_7b0 [16];
  undefined1 local_7a0 [16];
  undefined4 local_784;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined4 local_6f4;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined4 local_6d4;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  ulong uStack_6a8;
  undefined1 local_6a0 [16];
  undefined1 local_690 [16];
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  ulong uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined1 local_620 [16];
  undefined8 local_610;
  undefined8 uStack_608;
  undefined1 local_600 [16];
  undefined1 local_5f0 [8];
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined1 local_5d0 [16];
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined4 local_594;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined1 local_560 [16];
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 local_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  float local_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  float local_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  float local_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  float local_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  float local_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_1864 = *(int *)((long)in_RSI + 0x2c);
  local_1868 = (int)in_RSI[6];
  local_186c = (int)in_RSI[7];
  local_1870 = (int)in_RSI[3];
  local_1874 = local_1864 * local_1868 * local_1870;
  local_1858 = in_RSI;
  for (local_1878 = 0; local_1878 < local_186c; local_1878 = local_1878 + 1) {
    local_1838 = &local_18c8;
    local_1664 = *(int *)((long)local_1858 + 0x2c);
    local_1668 = (int)local_1858[6];
    local_166c = *(undefined4 *)((long)local_1858 + 0x34);
    local_1678 = (undefined1 (*) [32])
                 (*local_1858 + local_1858[8] * (long)local_1878 * local_1858[2]);
    local_1680 = local_1858[2];
    local_1684 = (undefined4)local_1858[3];
    local_1690 = local_1858[4];
    local_1660 = &local_18c8;
    local_1650 = (long)local_1664 * (long)local_1668 * local_1680;
    local_1830 = &local_18c8;
    local_1820 = &local_18c8;
    local_1654 = 0x10;
    local_1844 = local_1878;
    local_1845 = 1;
    local_18c8 = 0;
    local_18b8 = 0;
    local_18b0 = 0;
    local_18a0 = 0;
    local_189c = 0;
    local_1898 = 0;
    local_1894 = 0;
    local_1890 = 0;
    local_1888 = 0;
    local_18c0 = 0;
    local_18d8 = 0;
    local_180c = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
    auVar1 = vinsertps_avx(ZEXT416(local_180c),ZEXT416(local_180c),0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416(local_180c),0x20);
    auVar1 = vinsertps_avx(auVar1,ZEXT416(local_180c),0x30);
    auVar2 = vinsertps_avx(ZEXT416(local_180c),ZEXT416(local_180c),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(local_180c),0x20);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(local_180c),0x30);
    auVar32._16_16_ = auVar1;
    auVar32._0_16_ = auVar2;
    local_15c0._0_8_ = auVar2._0_8_;
    local_15c0._8_8_ = auVar2._8_8_;
    local_15c0._16_8_ = auVar1._0_8_;
    local_15c0._24_8_ = auVar1._8_8_;
    local_1880 = local_1678;
    for (; local_18d8 + 7 < local_1874; local_18d8 = local_18d8 + 8) {
      local_1808 = local_1880;
      local_1760 = *(undefined8 *)*local_1880;
      uStack_1758 = *(undefined8 *)(*local_1880 + 8);
      uStack_1750 = *(undefined8 *)(*local_1880 + 0x10);
      uStack_1748 = *(undefined8 *)(*local_1880 + 0x18);
      local_17c8 = local_1880;
      local_1780 = local_15c0._0_8_;
      uStack_1778 = local_15c0._8_8_;
      uStack_1770 = local_15c0._16_8_;
      uStack_1768 = local_15c0._24_8_;
      local_1540 = ZEXT832(0) << 0x20;
      local_1560 = 0;
      local_1520._8_8_ = SUB328(ZEXT832(0),4);
      uStack_1558 = local_1520._8_8_;
      uStack_1550 = 0;
      uStack_1548 = 0;
      local_17a0 = vmaxps_avx(ZEXT832((ulong)local_1520._8_8_) << 0x40,*local_1880);
      local_14e0 = 0;
      uStack_14d8 = local_1520._8_8_;
      uStack_14d0 = 0;
      uStack_14c8 = 0;
      auVar6 = vminps_avx(ZEXT832((ulong)local_1520._8_8_) << 0x40,*local_1880);
      local_17c0._0_8_ = auVar6._0_8_;
      local_17c0._24_8_ = auVar6._24_8_;
      local_1340 = ZEXT832(0) << 0x20;
      local_1420 = 0x3f8000003f800000;
      uStack_1418 = 0x3f8000003f800000;
      uStack_1410 = 0x3f8000003f800000;
      uStack_1408 = 0x3f8000003f800000;
      local_1300 = local_17c0._0_8_;
      local_13a0._8_8_ = auVar6._8_8_;
      uStack_12f8 = local_13a0._8_8_;
      local_13a0._16_8_ = auVar6._16_8_;
      uStack_12f0 = local_13a0._16_8_;
      uStack_12e8 = local_17c0._24_8_;
      local_1320 = 0x42b0c0a542b0c0a5;
      uStack_1318 = 0x42b0c0a542b0c0a5;
      uStack_1310 = 0x42b0c0a542b0c0a5;
      uStack_1308 = 0x42b0c0a542b0c0a5;
      auVar12._8_8_ = 0x42b0c0a542b0c0a5;
      auVar12._0_8_ = 0x42b0c0a542b0c0a5;
      auVar12._16_8_ = 0x42b0c0a542b0c0a5;
      auVar12._24_8_ = 0x42b0c0a542b0c0a5;
      auVar6 = vminps_avx(auVar6,auVar12);
      local_13a0._0_8_ = auVar6._0_8_;
      local_1360 = local_13a0._0_8_;
      local_13a0._8_8_ = auVar6._8_8_;
      uStack_1358 = local_13a0._8_8_;
      local_13a0._16_8_ = auVar6._16_8_;
      uStack_1350 = local_13a0._16_8_;
      local_13a0._24_8_ = auVar6._24_8_;
      uStack_1348 = local_13a0._24_8_;
      local_1380 = 0xc2b0c0a5c2b0c0a5;
      uStack_1378 = 0xc2b0c0a5c2b0c0a5;
      uStack_1370 = 0xc2b0c0a5c2b0c0a5;
      uStack_1368 = 0xc2b0c0a5c2b0c0a5;
      auVar7._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar7._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar7._16_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar7._24_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar5 = vmaxps_avx(auVar6,auVar7);
      local_13a0._0_8_ = auVar5._0_8_;
      local_be0 = local_13a0._0_8_;
      local_13a0._8_8_ = auVar5._8_8_;
      uStack_bd8 = local_13a0._8_8_;
      local_13a0._16_8_ = auVar5._16_8_;
      uStack_bd0 = local_13a0._16_8_;
      local_13a0._24_8_ = auVar5._24_8_;
      uStack_bc8 = local_13a0._24_8_;
      local_c00 = 0x3fb8aa3b3fb8aa3b;
      uStack_bf8 = 0x3fb8aa3b3fb8aa3b;
      uStack_bf0 = 0x3fb8aa3b3fb8aa3b;
      uStack_be8 = 0x3fb8aa3b3fb8aa3b;
      local_1080 = 0x3f0000003f000000;
      uStack_1078 = 0x3f0000003f000000;
      uStack_1070 = 0x3f0000003f000000;
      uStack_1068 = 0x3f0000003f000000;
      uVar8 = local_13a0._0_8_;
      uVar9 = local_13a0._8_8_;
      uVar10 = local_13a0._16_8_;
      uVar11 = local_13a0._24_8_;
      local_b80 = 0x3fb8aa3b3fb8aa3b;
      uStack_b78 = 0x3fb8aa3b3fb8aa3b;
      uStack_b70 = 0x3fb8aa3b3fb8aa3b;
      uStack_b68 = 0x3fb8aa3b3fb8aa3b;
      local_b60._0_4_ = auVar5._0_4_;
      local_b60._4_4_ = auVar5._4_4_;
      uStack_b58._0_4_ = auVar5._8_4_;
      uStack_b58._4_4_ = auVar5._12_4_;
      uStack_b50._0_4_ = auVar5._16_4_;
      uStack_b50._4_4_ = auVar5._20_4_;
      uStack_b48._0_4_ = auVar5._24_4_;
      uStack_b84 = 0x3fb8aa3b;
      local_ba0 = (float)local_b60 * 1.442695;
      fStack_b9c = local_b60._4_4_ * 1.442695;
      fStack_b98 = (float)uStack_b58 * 1.442695;
      fStack_b94 = uStack_b58._4_4_ * 1.442695;
      fStack_b90 = (float)uStack_b50 * 1.442695;
      fStack_b8c = uStack_b50._4_4_ * 1.442695;
      fStack_b88 = (float)uStack_b48 * 1.442695;
      local_bc0 = 0x3f0000003f000000;
      uStack_bb8 = 0x3f0000003f000000;
      uStack_bb0 = 0x3f0000003f000000;
      uStack_ba8 = 0x3f0000003f000000;
      local_13e0._4_4_ = fStack_b9c + 0.5;
      local_13e0._0_4_ = local_ba0 + 0.5;
      uStack_13d8._0_4_ = fStack_b98 + 0.5;
      uStack_13d8._4_4_ = fStack_b94 + 0.5;
      uStack_13d0._0_4_ = fStack_b90 + 0.5;
      uStack_13d0._4_4_ = fStack_b8c + 0.5;
      uStack_13c8._0_4_ = fStack_b88 + 0.5;
      uStack_13c8._4_4_ = 0x3ff8aa3b;
      auVar7 = vroundps_avx(_local_13e0,1);
      auVar6 = vcmpps_avx(_local_13e0,auVar7,1);
      local_1440._0_8_ = auVar6._0_8_;
      local_b20 = local_1440._0_8_;
      local_1440._8_8_ = auVar6._8_8_;
      uStack_b18 = local_1440._8_8_;
      local_1440._16_8_ = auVar6._16_8_;
      uStack_b10 = local_1440._16_8_;
      local_1440._24_8_ = auVar6._24_8_;
      uStack_b08 = local_1440._24_8_;
      local_b40 = 0x3f8000003f800000;
      uStack_b38 = 0x3f8000003f800000;
      uStack_b30 = 0x3f8000003f800000;
      uStack_b28 = 0x3f8000003f800000;
      auVar13._8_8_ = 0x3f8000003f800000;
      auVar13._0_8_ = 0x3f8000003f800000;
      auVar13._16_8_ = 0x3f8000003f800000;
      auVar13._24_8_ = 0x3f8000003f800000;
      local_1440 = vandps_avx(auVar6,auVar13);
      local_13c0 = auVar7._0_8_;
      local_12c0 = local_13c0;
      uStack_13b8 = auVar7._8_8_;
      uStack_12b8 = uStack_13b8;
      uStack_13b0 = auVar7._16_8_;
      uStack_12b0 = uStack_13b0;
      uStack_13a8 = auVar7._24_8_;
      uStack_12a8 = uStack_13a8;
      local_12e0 = local_1440._0_8_;
      uStack_12d8 = local_1440._8_8_;
      uStack_12d0 = local_1440._16_8_;
      uStack_12c8 = local_1440._24_8_;
      _local_13e0 = vsubps_avx(auVar7,local_1440);
      local_9e0 = local_13e0;
      uStack_9d8 = uStack_13d8;
      uStack_9d0 = uStack_13d0;
      uStack_9c8 = uStack_13c8;
      local_a20 = local_13a0._0_8_;
      uStack_a18 = local_13a0._8_8_;
      uStack_a10 = local_13a0._16_8_;
      uStack_a08 = local_13a0._24_8_;
      local_a00 = 0x3f3180003f318000;
      uStack_9f8 = 0x3f3180003f318000;
      uStack_9f0 = 0x3f3180003f318000;
      uStack_9e8 = 0x3f3180003f318000;
      local_9a0 = local_13a0._0_8_;
      uStack_998 = local_13a0._8_8_;
      uStack_990 = local_13a0._16_8_;
      uStack_988 = local_13a0._24_8_;
      local_980 = 0x3f3180003f318000;
      uStack_978 = 0x3f3180003f318000;
      uStack_970 = 0x3f3180003f318000;
      uStack_968 = 0x3f3180003f318000;
      local_960._0_4_ = local_13e0._0_4_;
      local_960._4_4_ = local_13e0._4_4_;
      uStack_958._0_4_ = local_13e0._8_4_;
      uStack_958._4_4_ = local_13e0._12_4_;
      uStack_950._0_4_ = local_13e0._16_4_;
      uStack_950._4_4_ = local_13e0._20_4_;
      uStack_948._0_4_ = local_13e0._24_4_;
      uStack_948._4_4_ = local_13e0._28_4_;
      fStack_9a4 = uStack_948._4_4_;
      local_9c0 = (float)local_960 * 0.6933594;
      fStack_9bc = local_960._4_4_ * 0.6933594;
      fStack_9b8 = (float)uStack_958 * 0.6933594;
      fStack_9b4 = uStack_958._4_4_ * 0.6933594;
      fStack_9b0 = (float)uStack_950 * 0.6933594;
      fStack_9ac = uStack_950._4_4_ * 0.6933594;
      fStack_9a8 = (float)uStack_948 * 0.6933594;
      auVar15._4_4_ = fStack_9bc;
      auVar15._0_4_ = local_9c0;
      auVar15._8_4_ = fStack_9b8;
      auVar15._12_4_ = fStack_9b4;
      auVar15._16_4_ = fStack_9b0;
      auVar15._20_4_ = fStack_9ac;
      auVar15._24_4_ = fStack_9a8;
      auVar15._28_4_ = uStack_948._4_4_;
      auVar6 = vsubps_avx(auVar5,auVar15);
      local_ac0 = local_13e0;
      uStack_ab8 = uStack_13d8;
      uStack_ab0 = uStack_13d0;
      uStack_aa8 = uStack_13c8;
      local_13a0._0_8_ = auVar6._0_8_;
      local_b00 = local_13a0._0_8_;
      local_13a0._8_8_ = auVar6._8_8_;
      uStack_af8 = local_13a0._8_8_;
      local_13a0._16_8_ = auVar6._16_8_;
      uStack_af0 = local_13a0._16_8_;
      local_13a0._24_8_ = auVar6._24_8_;
      uStack_ae8 = local_13a0._24_8_;
      local_ae0 = 0xb95e8083b95e8083;
      uStack_ad8 = 0xb95e8083b95e8083;
      uStack_ad0 = 0xb95e8083b95e8083;
      uStack_ac8 = 0xb95e8083b95e8083;
      local_a80 = local_13a0._0_8_;
      uStack_a78 = local_13a0._8_8_;
      uStack_a70 = local_13a0._16_8_;
      uStack_a68 = local_13a0._24_8_;
      local_a40 = local_13e0;
      uStack_a38 = uStack_13d8;
      uStack_a30 = uStack_13d0;
      uStack_a28 = uStack_13c8;
      local_a60 = 0xb95e8083b95e8083;
      uStack_a58 = 0xb95e8083b95e8083;
      uStack_a50 = 0xb95e8083b95e8083;
      uStack_a48 = 0xb95e8083b95e8083;
      fStack_a84 = uStack_948._4_4_;
      local_aa0 = (float)local_960 * -0.00021219444;
      fStack_a9c = local_960._4_4_ * -0.00021219444;
      fStack_a98 = (float)uStack_958 * -0.00021219444;
      fStack_a94 = uStack_958._4_4_ * -0.00021219444;
      fStack_a90 = (float)uStack_950 * -0.00021219444;
      fStack_a8c = uStack_950._4_4_ * -0.00021219444;
      fStack_a88 = (float)uStack_948 * -0.00021219444;
      auVar14._4_4_ = fStack_a9c;
      auVar14._0_4_ = local_aa0;
      auVar14._8_4_ = fStack_a98;
      auVar14._12_4_ = fStack_a94;
      auVar14._16_4_ = fStack_a90;
      auVar14._20_4_ = fStack_a8c;
      auVar14._24_4_ = fStack_a88;
      auVar14._28_4_ = uStack_948._4_4_;
      local_13a0 = vsubps_avx(auVar6,auVar14);
      local_11e0 = local_13a0._0_8_;
      uStack_11d8 = local_13a0._8_8_;
      uStack_11d0 = local_13a0._16_8_;
      uStack_11c8 = local_13a0._24_8_;
      local_11c0._0_4_ = local_13a0._0_4_;
      local_11c0._4_4_ = local_13a0._4_4_;
      uStack_11b8._0_4_ = local_13a0._8_4_;
      uStack_11b8._4_4_ = local_13a0._12_4_;
      uStack_11b0._0_4_ = local_13a0._16_4_;
      uStack_11b0._4_4_ = local_13a0._20_4_;
      uStack_11a8._0_4_ = local_13a0._24_4_;
      uStack_11a8._4_4_ = local_13a0._28_4_;
      local_13c0 = CONCAT44(local_11c0._4_4_ * local_11c0._4_4_,
                            (float)local_11c0 * (float)local_11c0);
      uStack_13b8._0_4_ = (float)uStack_11b8 * (float)uStack_11b8;
      uStack_13b8._4_4_ = uStack_11b8._4_4_ * uStack_11b8._4_4_;
      uStack_13b0._0_4_ = (float)uStack_11b0 * (float)uStack_11b0;
      uStack_13b0._4_4_ = uStack_11b0._4_4_ * uStack_11b0._4_4_;
      auVar29 = _local_13c0;
      uStack_13a8._0_4_ = (float)uStack_11a8 * (float)uStack_11a8;
      uStack_13a8._4_4_ = uStack_11a8._4_4_;
      auVar7 = _local_13c0;
      local_cc0 = 0x3950696739506967;
      uStack_cb8 = 0x3950696739506967;
      uStack_cb0 = 0x3950696739506967;
      uStack_ca8 = 0x3950696739506967;
      local_ce0 = local_13a0._0_8_;
      uStack_cd8 = local_13a0._8_8_;
      uStack_cd0 = local_13a0._16_8_;
      uStack_cc8 = local_13a0._24_8_;
      local_d00 = 0x3ab743ce3ab743ce;
      uStack_cf8 = 0x3ab743ce3ab743ce;
      uStack_cf0 = 0x3ab743ce3ab743ce;
      uStack_ce8 = 0x3ab743ce3ab743ce;
      local_c40 = 0x3950696739506967;
      uStack_c38 = 0x3950696739506967;
      uStack_c30 = 0x3950696739506967;
      uStack_c28 = 0x3950696739506967;
      local_c60 = local_13a0._0_8_;
      uStack_c58 = local_13a0._8_8_;
      uStack_c50 = local_13a0._16_8_;
      uStack_c48 = local_13a0._24_8_;
      fStack_c64 = uStack_11a8._4_4_;
      local_c80 = (float)local_11c0 * 0.00019875691;
      fStack_c7c = local_11c0._4_4_ * 0.00019875691;
      fStack_c78 = (float)uStack_11b8 * 0.00019875691;
      fStack_c74 = uStack_11b8._4_4_ * 0.00019875691;
      fStack_c70 = (float)uStack_11b0 * 0.00019875691;
      fStack_c6c = uStack_11b0._4_4_ * 0.00019875691;
      fStack_c68 = (float)uStack_11a8 * 0.00019875691;
      local_ca0 = 0x3ab743ce3ab743ce;
      uStack_c98 = 0x3ab743ce3ab743ce;
      uStack_c90 = 0x3ab743ce3ab743ce;
      uStack_c88 = 0x3ab743ce3ab743ce;
      local_1460 = CONCAT44(fStack_c7c + 0.0013981999,local_c80 + 0.0013981999);
      uStack_1458 = CONCAT44(fStack_c74 + 0.0013981999,fStack_c78 + 0.0013981999);
      uStack_1450 = CONCAT44(fStack_c6c + 0.0013981999,fStack_c70 + 0.0013981999);
      uStack_1448 = CONCAT44(uStack_11a8._4_4_ + 0.0013981999,fStack_c68 + 0.0013981999);
      local_da0 = local_1460;
      uStack_d98 = uStack_1458;
      uStack_d90 = uStack_1450;
      uStack_d88 = uStack_1448;
      local_dc0 = local_13a0._0_8_;
      uStack_db8 = local_13a0._8_8_;
      uStack_db0 = local_13a0._16_8_;
      uStack_da8 = local_13a0._24_8_;
      local_de0 = 0x3c0889083c088908;
      uStack_dd8 = 0x3c0889083c088908;
      uStack_dd0 = 0x3c0889083c088908;
      uStack_dc8 = 0x3c0889083c088908;
      local_d20 = local_1460;
      uStack_d18 = uStack_1458;
      uStack_d10 = uStack_1450;
      uStack_d08 = uStack_1448;
      local_d40 = local_13a0._0_8_;
      uStack_d38 = local_13a0._8_8_;
      uStack_d30 = local_13a0._16_8_;
      uStack_d28 = local_13a0._24_8_;
      fStack_d44 = uStack_11a8._4_4_;
      local_d60 = (local_c80 + 0.0013981999) * (float)local_11c0;
      fStack_d5c = (fStack_c7c + 0.0013981999) * local_11c0._4_4_;
      fStack_d58 = (fStack_c78 + 0.0013981999) * (float)uStack_11b8;
      fStack_d54 = (fStack_c74 + 0.0013981999) * uStack_11b8._4_4_;
      fStack_d50 = (fStack_c70 + 0.0013981999) * (float)uStack_11b0;
      fStack_d4c = (fStack_c6c + 0.0013981999) * uStack_11b0._4_4_;
      fStack_d48 = (fStack_c68 + 0.0013981999) * (float)uStack_11a8;
      local_d80 = 0x3c0889083c088908;
      uStack_d78 = 0x3c0889083c088908;
      uStack_d70 = 0x3c0889083c088908;
      uStack_d68 = 0x3c0889083c088908;
      local_1460 = CONCAT44(fStack_d5c + 0.008333452,local_d60 + 0.008333452);
      uStack_1458 = CONCAT44(fStack_d54 + 0.008333452,fStack_d58 + 0.008333452);
      uStack_1450 = CONCAT44(fStack_d4c + 0.008333452,fStack_d50 + 0.008333452);
      uStack_1448 = CONCAT44(uStack_11a8._4_4_ + 0.008333452,fStack_d48 + 0.008333452);
      local_e80 = local_1460;
      uStack_e78 = uStack_1458;
      uStack_e70 = uStack_1450;
      uStack_e68 = uStack_1448;
      local_ea0 = local_13a0._0_8_;
      uStack_e98 = local_13a0._8_8_;
      uStack_e90 = local_13a0._16_8_;
      uStack_e88 = local_13a0._24_8_;
      local_ec0 = 0x3d2aa9c13d2aa9c1;
      uStack_eb8 = 0x3d2aa9c13d2aa9c1;
      uStack_eb0 = 0x3d2aa9c13d2aa9c1;
      uStack_ea8 = 0x3d2aa9c13d2aa9c1;
      local_e00 = local_1460;
      uStack_df8 = uStack_1458;
      uStack_df0 = uStack_1450;
      uStack_de8 = uStack_1448;
      local_e20 = local_13a0._0_8_;
      uStack_e18 = local_13a0._8_8_;
      uStack_e10 = local_13a0._16_8_;
      uStack_e08 = local_13a0._24_8_;
      fStack_e24 = uStack_11a8._4_4_;
      local_e40 = (local_d60 + 0.008333452) * (float)local_11c0;
      fStack_e3c = (fStack_d5c + 0.008333452) * local_11c0._4_4_;
      fStack_e38 = (fStack_d58 + 0.008333452) * (float)uStack_11b8;
      fStack_e34 = (fStack_d54 + 0.008333452) * uStack_11b8._4_4_;
      fStack_e30 = (fStack_d50 + 0.008333452) * (float)uStack_11b0;
      fStack_e2c = (fStack_d4c + 0.008333452) * uStack_11b0._4_4_;
      fStack_e28 = (fStack_d48 + 0.008333452) * (float)uStack_11a8;
      local_e60 = 0x3d2aa9c13d2aa9c1;
      uStack_e58 = 0x3d2aa9c13d2aa9c1;
      uStack_e50 = 0x3d2aa9c13d2aa9c1;
      uStack_e48 = 0x3d2aa9c13d2aa9c1;
      local_1460 = CONCAT44(fStack_e3c + 0.041665796,local_e40 + 0.041665796);
      uStack_1458 = CONCAT44(fStack_e34 + 0.041665796,fStack_e38 + 0.041665796);
      uStack_1450 = CONCAT44(fStack_e2c + 0.041665796,fStack_e30 + 0.041665796);
      uStack_1448 = CONCAT44(uStack_11a8._4_4_ + 0.041665796,fStack_e28 + 0.041665796);
      local_f60 = local_1460;
      uStack_f58 = uStack_1458;
      uStack_f50 = uStack_1450;
      uStack_f48 = uStack_1448;
      local_f80 = local_13a0._0_8_;
      uStack_f78 = local_13a0._8_8_;
      uStack_f70 = local_13a0._16_8_;
      uStack_f68 = local_13a0._24_8_;
      local_fa0 = 0x3e2aaaaa3e2aaaaa;
      uStack_f98 = 0x3e2aaaaa3e2aaaaa;
      uStack_f90 = 0x3e2aaaaa3e2aaaaa;
      uStack_f88 = 0x3e2aaaaa3e2aaaaa;
      local_ee0 = local_1460;
      uStack_ed8 = uStack_1458;
      uStack_ed0 = uStack_1450;
      uStack_ec8 = uStack_1448;
      local_f00 = local_13a0._0_8_;
      uStack_ef8 = local_13a0._8_8_;
      uStack_ef0 = local_13a0._16_8_;
      uStack_ee8 = local_13a0._24_8_;
      fStack_f04 = uStack_11a8._4_4_;
      local_f20 = (local_e40 + 0.041665796) * (float)local_11c0;
      fStack_f1c = (fStack_e3c + 0.041665796) * local_11c0._4_4_;
      fStack_f18 = (fStack_e38 + 0.041665796) * (float)uStack_11b8;
      fStack_f14 = (fStack_e34 + 0.041665796) * uStack_11b8._4_4_;
      fStack_f10 = (fStack_e30 + 0.041665796) * (float)uStack_11b0;
      fStack_f0c = (fStack_e2c + 0.041665796) * uStack_11b0._4_4_;
      fStack_f08 = (fStack_e28 + 0.041665796) * (float)uStack_11a8;
      local_f40 = 0x3e2aaaaa3e2aaaaa;
      uStack_f38 = 0x3e2aaaaa3e2aaaaa;
      uStack_f30 = 0x3e2aaaaa3e2aaaaa;
      uStack_f28 = 0x3e2aaaaa3e2aaaaa;
      local_1460 = CONCAT44(fStack_f1c + 0.16666666,local_f20 + 0.16666666);
      uStack_1458 = CONCAT44(fStack_f14 + 0.16666666,fStack_f18 + 0.16666666);
      uStack_1450 = CONCAT44(fStack_f0c + 0.16666666,fStack_f10 + 0.16666666);
      uStack_1448 = CONCAT44(uStack_11a8._4_4_ + 0.16666666,fStack_f08 + 0.16666666);
      local_1040 = local_1460;
      uStack_1038 = uStack_1458;
      uStack_1030 = uStack_1450;
      uStack_1028 = uStack_1448;
      local_1060 = local_13a0._0_8_;
      uStack_1058 = local_13a0._8_8_;
      uStack_1050 = local_13a0._16_8_;
      uStack_1048 = local_13a0._24_8_;
      local_fc0 = local_1460;
      uStack_fb8 = uStack_1458;
      uStack_fb0 = uStack_1450;
      uStack_fa8 = uStack_1448;
      local_fe0 = local_13a0._0_8_;
      uStack_fd8 = local_13a0._8_8_;
      uStack_fd0 = local_13a0._16_8_;
      uStack_fc8 = local_13a0._24_8_;
      fStack_fe4 = uStack_11a8._4_4_;
      local_1000 = (local_f20 + 0.16666666) * (float)local_11c0;
      fStack_ffc = (fStack_f1c + 0.16666666) * local_11c0._4_4_;
      fStack_ff8 = (fStack_f18 + 0.16666666) * (float)uStack_11b8;
      fStack_ff4 = (fStack_f14 + 0.16666666) * uStack_11b8._4_4_;
      fStack_ff0 = (fStack_f10 + 0.16666666) * (float)uStack_11b0;
      fStack_fec = (fStack_f0c + 0.16666666) * uStack_11b0._4_4_;
      fStack_fe8 = (fStack_f08 + 0.16666666) * (float)uStack_11a8;
      local_1020 = 0x3f0000003f000000;
      uStack_1018 = 0x3f0000003f000000;
      uStack_1010 = 0x3f0000003f000000;
      uStack_1008 = 0x3f0000003f000000;
      local_1460 = CONCAT44(fStack_ffc + 0.5,local_1000 + 0.5);
      uStack_1458 = CONCAT44(fStack_ff4 + 0.5,fStack_ff8 + 0.5);
      uStack_1450 = CONCAT44(fStack_fec + 0.5,fStack_ff0 + 0.5);
      uStack_1448 = CONCAT44(uStack_11a8._4_4_ + 0.5,fStack_fe8 + 0.5);
      local_1120 = local_1460;
      uStack_1118 = uStack_1458;
      uStack_1110 = uStack_1450;
      uStack_1108 = uStack_1448;
      local_1140 = local_13c0;
      uStack_1138 = uStack_13b8;
      uStack_13b0 = auVar29._16_8_;
      uStack_1130 = uStack_13b0;
      uStack_13a8 = auVar7._24_8_;
      uStack_1128 = uStack_13a8;
      local_1160 = local_13a0._0_8_;
      uStack_1158 = local_13a0._8_8_;
      uStack_1150 = local_13a0._16_8_;
      uStack_1148 = local_13a0._24_8_;
      local_10a0 = local_1460;
      uStack_1098 = uStack_1458;
      uStack_1090 = uStack_1450;
      uStack_1088 = uStack_1448;
      local_10c0 = local_13c0;
      uStack_10b8 = uStack_13b8;
      uStack_10b0 = uStack_13b0;
      uStack_10a8 = uStack_13a8;
      fStack_10c4 = uStack_11a8._4_4_;
      local_10e0 = (local_1000 + 0.5) * (float)local_11c0 * (float)local_11c0;
      fStack_10dc = (fStack_ffc + 0.5) * local_11c0._4_4_ * local_11c0._4_4_;
      fStack_10d8 = (fStack_ff8 + 0.5) * (float)uStack_11b8 * (float)uStack_11b8;
      fStack_10d4 = (fStack_ff4 + 0.5) * uStack_11b8._4_4_ * uStack_11b8._4_4_;
      fStack_10d0 = (fStack_ff0 + 0.5) * (float)uStack_11b0 * (float)uStack_11b0;
      fStack_10cc = (fStack_fec + 0.5) * uStack_11b0._4_4_ * uStack_11b0._4_4_;
      fStack_10c8 = (fStack_fe8 + 0.5) * (float)uStack_11a8 * (float)uStack_11a8;
      local_1100 = local_13a0._0_8_;
      uStack_10f8 = local_13a0._8_8_;
      uStack_10f0 = local_13a0._16_8_;
      uStack_10e8 = local_13a0._24_8_;
      local_1460 = CONCAT44(fStack_10dc + local_11c0._4_4_,local_10e0 + (float)local_11c0);
      uStack_1458 = CONCAT44(fStack_10d4 + uStack_11b8._4_4_,fStack_10d8 + (float)uStack_11b8);
      uStack_1450 = CONCAT44(fStack_10cc + uStack_11b0._4_4_,fStack_10d0 + (float)uStack_11b0);
      uStack_1448 = CONCAT44(uStack_11a8._4_4_ + uStack_11a8._4_4_,fStack_10c8 + (float)uStack_11a8)
      ;
      local_1280 = local_1460;
      uStack_1278 = uStack_1458;
      uStack_1270 = uStack_1450;
      uStack_1268 = uStack_1448;
      local_12a0 = 0x3f8000003f800000;
      uStack_1298 = 0x3f8000003f800000;
      uStack_1290 = 0x3f8000003f800000;
      uStack_1288 = 0x3f8000003f800000;
      fVar30 = local_10e0 + (float)local_11c0 + 1.0;
      fVar34 = fStack_10dc + local_11c0._4_4_ + 1.0;
      fVar35 = fStack_10d8 + (float)uStack_11b8 + 1.0;
      fVar36 = fStack_10d4 + uStack_11b8._4_4_ + 1.0;
      fVar37 = fStack_10d0 + (float)uStack_11b0 + 1.0;
      fVar38 = fStack_10cc + uStack_11b0._4_4_ + 1.0;
      fVar39 = fStack_10c8 + (float)uStack_11a8 + 1.0;
      fVar40 = uStack_11a8._4_4_ + uStack_11a8._4_4_ + 1.0;
      local_1460 = CONCAT44(fVar34,fVar30);
      uStack_1458 = CONCAT44(fVar36,fVar35);
      uStack_1450 = CONCAT44(fVar38,fVar37);
      uStack_1448 = CONCAT44(fVar40,fVar39);
      local_940 = local_13e0;
      uStack_938 = uStack_13d8;
      uStack_930 = uStack_13d0;
      uStack_928 = uStack_13c8;
      local_1400 = CONCAT44((int)local_960._4_4_,(int)(float)local_960);
      uStack_13f8 = CONCAT44((int)uStack_958._4_4_,(int)(float)uStack_958);
      uStack_13f0 = CONCAT44((int)uStack_950._4_4_,(int)(float)uStack_950);
      uStack_13e8 = CONCAT44((int)uStack_948._4_4_,(int)(float)uStack_948);
      local_840 = local_1400;
      uStack_838 = uStack_13f8;
      uStack_830 = uStack_13f0;
      uStack_828 = uStack_13e8;
      local_860 = 0x7f0000007f;
      uStack_858 = 0x7f0000007f;
      uStack_850 = 0x7f0000007f;
      uStack_848 = 0x7f0000007f;
      local_8e0 = local_1400;
      uStack_8d8 = uStack_13f8;
      uStack_8d0 = uStack_13f0;
      uStack_8c8 = uStack_13e8;
      local_900 = 0x7f0000007f;
      uStack_8f8 = 0x7f0000007f;
      uStack_8f0 = 0x7f0000007f;
      uStack_8e8 = 0x7f0000007f;
      local_890 = 0x7f0000007f;
      uStack_888 = 0x7f0000007f;
      local_8a0 = 0x7f0000007f;
      uStack_898 = 0x7f0000007f;
      local_710 = local_1400;
      uStack_708 = uStack_13f8;
      local_720 = 0x7f0000007f;
      uStack_718 = 0x7f0000007f;
      auVar17._8_8_ = uStack_13f8;
      auVar17._0_8_ = local_1400;
      auVar16._8_8_ = 0x7f0000007f;
      auVar16._0_8_ = 0x7f0000007f;
      local_870 = vpaddd_avx(auVar17,auVar16);
      local_730 = uStack_13f0;
      uStack_728 = uStack_13e8;
      local_740 = 0x7f0000007f;
      uStack_738 = 0x7f0000007f;
      auVar4._8_8_ = uStack_13e8;
      auVar4._0_8_ = uStack_13f0;
      auVar3._8_8_ = 0x7f0000007f;
      auVar3._0_8_ = 0x7f0000007f;
      local_880 = vpaddd_avx(auVar4,auVar3);
      local_920 = local_870._0_8_;
      uStack_918 = local_870._8_8_;
      uStack_910 = local_880._0_8_;
      uStack_908 = local_880._8_8_;
      local_8c0 = local_870._0_8_;
      uStack_8b8 = local_870._8_8_;
      uStack_8b0 = local_880._0_8_;
      uStack_8a8 = local_880._8_8_;
      local_780 = local_870._0_8_;
      uStack_778 = local_870._8_8_;
      uStack_770 = local_880._0_8_;
      uStack_768 = local_880._8_8_;
      local_784 = 0x17;
      local_800 = local_870._0_8_;
      uStack_7f8 = local_870._8_8_;
      uStack_7f0 = local_880._0_8_;
      uStack_7e8 = local_880._8_8_;
      local_6d0 = local_870._0_8_;
      uStack_6c8 = local_870._8_8_;
      local_6d4 = 0x17;
      local_7a0 = vpslld_avx(local_870,ZEXT416(0x17));
      local_6f0 = local_880._0_8_;
      uStack_6e8 = local_880._8_8_;
      local_6f4 = 0x17;
      local_7b0 = vpslld_avx(local_880,ZEXT416(0x17));
      local_820 = local_7a0._0_8_;
      uStack_818 = local_7a0._8_8_;
      uStack_810 = local_7b0._0_8_;
      uStack_808 = local_7b0._8_8_;
      local_7e0 = local_7a0._0_8_;
      uStack_7d8 = local_7a0._8_8_;
      uStack_7d0 = local_7b0._0_8_;
      uStack_7c8 = local_7b0._8_8_;
      local_1400 = local_7a0._0_8_;
      uStack_13f8 = local_7a0._8_8_;
      uStack_13f0 = local_7b0._0_8_;
      uStack_13e8 = local_7b0._8_8_;
      local_760 = local_7a0._0_8_;
      uStack_758 = local_7a0._8_8_;
      uStack_750 = local_7b0._0_8_;
      uStack_748 = local_7b0._8_8_;
      local_1480 = local_7a0._0_8_;
      uStack_1478 = local_7a0._8_8_;
      uStack_1470 = local_7b0._0_8_;
      uStack_1468 = local_7b0._8_8_;
      local_1200 = local_1460;
      uStack_11f8 = uStack_1458;
      uStack_11f0 = uStack_1450;
      uStack_11e8 = uStack_1448;
      local_1220._0_4_ = local_7a0._0_4_;
      local_1220._4_4_ = local_7a0._4_4_;
      uStack_1218._0_4_ = local_7a0._8_4_;
      uStack_1218._4_4_ = local_7a0._12_4_;
      uStack_1210._0_4_ = local_7b0._0_4_;
      uStack_1210._4_4_ = local_7b0._4_4_;
      uStack_1208._0_4_ = local_7b0._8_4_;
      local_1460 = CONCAT44(fVar34 * local_1220._4_4_,fVar30 * (float)local_1220);
      uStack_1458 = CONCAT44(fVar36 * uStack_1218._4_4_,fVar35 * (float)uStack_1218);
      uStack_1450 = CONCAT44(fVar38 * uStack_1210._4_4_,fVar37 * (float)uStack_1210);
      uStack_1448 = CONCAT44(fVar40,fVar39 * (float)uStack_1208);
      local_14a0 = local_1460;
      uStack_1498 = uStack_1458;
      uStack_1490 = uStack_1450;
      uStack_1488 = uStack_1448;
      local_1734 = 0x3f800000;
      local_15e0 = 0x3f800000;
      auVar3 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x20);
      auVar3 = vinsertps_avx(auVar3,ZEXT416(0x3f800000),0x30);
      auVar4 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x30);
      auVar33._16_16_ = auVar3;
      auVar33._0_16_ = auVar4;
      local_1600._0_8_ = auVar4._0_8_;
      local_14c0 = local_1600._0_8_;
      local_1600._8_8_ = auVar4._8_8_;
      uStack_14b8 = local_1600._8_8_;
      local_1600._16_8_ = auVar3._0_8_;
      uStack_14b0 = local_1600._16_8_;
      local_1600._24_8_ = auVar3._8_8_;
      uStack_14a8 = local_1600._24_8_;
      auVar5._8_8_ = uStack_1458;
      auVar5._0_8_ = local_1460;
      auVar5._16_8_ = uStack_1450;
      auVar5._24_8_ = uStack_1448;
      auVar6._16_8_ = local_1600._16_8_;
      auVar6._0_16_ = auVar4;
      auVar6._24_8_ = local_1600._24_8_;
      local_17c0 = vsubps_avx(auVar5,auVar6);
      local_1180._0_4_ = auVar2._0_4_;
      local_1180._4_4_ = auVar2._4_4_;
      uStack_1178._0_4_ = auVar2._8_4_;
      uStack_1178._4_4_ = auVar2._12_4_;
      uStack_1170._0_4_ = auVar1._0_4_;
      uStack_1170._4_4_ = auVar1._4_4_;
      uStack_1168._0_4_ = auVar1._8_4_;
      uStack_1168._4_4_ = auVar1._12_4_;
      fStack_1244 = uStack_1168._4_4_;
      local_11a0._0_4_ = local_17c0._0_4_;
      local_11a0._4_4_ = local_17c0._4_4_;
      uStack_1198._0_4_ = local_17c0._8_4_;
      uStack_1198._4_4_ = local_17c0._12_4_;
      uStack_1190._0_4_ = local_17c0._16_4_;
      uStack_1190._4_4_ = local_17c0._20_4_;
      uStack_1188._0_4_ = local_17c0._24_4_;
      local_1260 = (float)local_1180 * (float)local_11a0;
      fStack_125c = local_1180._4_4_ * local_11a0._4_4_;
      fStack_1258 = (float)uStack_1178 * (float)uStack_1198;
      fStack_1254 = uStack_1178._4_4_ * uStack_1198._4_4_;
      fStack_1250 = (float)uStack_1170 * (float)uStack_1190;
      fStack_124c = uStack_1170._4_4_ * uStack_1190._4_4_;
      fStack_1248 = (float)uStack_1168 * (float)uStack_1188;
      local_1240._0_4_ = local_17a0._0_4_;
      local_1240._4_4_ = local_17a0._4_4_;
      fStack_1238 = local_17a0._8_4_;
      fStack_1234 = local_17a0._12_4_;
      fStack_1230 = local_17a0._16_4_;
      fStack_122c = local_17a0._20_4_;
      fStack_1228 = local_17a0._24_4_;
      fStack_1224 = local_17a0._28_4_;
      local_1800 = (float)local_1240._0_4_ + local_1260;
      fStack_17fc = (float)local_1240._4_4_ + fStack_125c;
      fStack_17f8 = fStack_1238 + fStack_1258;
      fStack_17f4 = fStack_1234 + fStack_1254;
      fStack_17f0 = fStack_1230 + fStack_1250;
      fStack_17ec = fStack_122c + fStack_124c;
      fStack_17e8 = fStack_1228 + fStack_1248;
      fStack_17e4 = fStack_1224 + uStack_1168._4_4_;
      *(ulong *)*local_1880 = CONCAT44(fStack_17fc,local_1800);
      *(ulong *)(*local_1880 + 8) = CONCAT44(fStack_17f4,fStack_17f8);
      *(ulong *)(*local_1880 + 0x10) = CONCAT44(fStack_17ec,fStack_17f0);
      *(ulong *)(*local_1880 + 0x18) = CONCAT44(fStack_17e4,fStack_17e8);
      local_1880 = local_1880 + 1;
      local_1600 = auVar33;
      local_15dc = local_15e0;
      local_15d8 = local_15e0;
      local_15d4 = local_15e0;
      local_15d0 = local_15e0;
      local_15cc = local_15e0;
      local_15c8 = local_15e0;
      local_15c4 = local_15e0;
      local_1580 = local_1760;
      uStack_1578 = uStack_1758;
      uStack_1570 = uStack_1750;
      uStack_1568 = uStack_1748;
      local_1520 = local_1540;
      local_1500 = local_1760;
      uStack_14f8 = uStack_1758;
      uStack_14f0 = uStack_1750;
      uStack_14e8 = uStack_1748;
      _local_13c0 = auVar7;
      _local_1240 = local_17a0;
      local_1220 = local_7a0._0_8_;
      uStack_1218 = local_7a0._8_8_;
      uStack_1210 = local_7b0._0_8_;
      uStack_1208 = local_7b0._8_8_;
      local_11c0 = local_11e0;
      uStack_11b8 = uStack_11d8;
      uStack_11b0 = uStack_11d0;
      uStack_11a8 = uStack_11c8;
      local_11a0 = local_17c0._0_8_;
      uStack_1198 = local_17c0._8_8_;
      uStack_1190 = local_17c0._16_8_;
      uStack_1188 = local_17c0._24_8_;
      local_1180 = local_15c0._0_8_;
      uStack_1178 = local_15c0._8_8_;
      uStack_1170 = local_15c0._16_8_;
      uStack_1168 = local_15c0._24_8_;
      local_c20 = local_1080;
      uStack_c18 = uStack_1078;
      uStack_c10 = uStack_1070;
      uStack_c08 = uStack_1068;
      local_b60 = uVar8;
      uStack_b58 = uVar9;
      uStack_b50 = uVar10;
      uStack_b48 = uVar11;
      local_960 = local_13e0;
      uStack_958 = uStack_13d8;
      uStack_950 = uStack_13d0;
      uStack_948 = uStack_13c8;
    }
    local_1730 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
    for (; fStack_172c = local_1730, fStack_1728 = local_1730, fStack_1724 = local_1730,
        local_171c = local_1730, local_1630 = local_1820, local_15c0 = auVar32,
        local_15a0 = local_180c, local_159c = local_180c, local_1598 = local_180c,
        local_1594 = local_180c, local_1590 = local_180c, local_158c = local_180c,
        local_1588 = local_180c, local_1584 = local_180c, local_18a8 = local_1690,
        local_18d8 + 3 < local_1874; local_18d8 = local_18d8 + 4) {
      local_1718 = local_1880;
      local_16c0 = *(undefined8 *)*local_1880;
      uStack_16b8 = *(undefined8 *)(*local_1880 + 8);
      local_16f8 = local_1880;
      local_6a0 = ZEXT816(0) << 0x20;
      local_6b0 = 0;
      local_690._8_8_ = SUB168(ZEXT816(0),4);
      uStack_6a8 = local_690._8_8_;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = local_690._8_8_;
      local_16e0 = vmaxps_avx(auVar27 << 0x40,*(undefined1 (*) [16])*local_1880);
      local_670 = 0;
      uStack_668 = local_690._8_8_;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_690._8_8_;
      auVar1 = vminps_avx(auVar28 << 0x40,*(undefined1 (*) [16])*local_1880);
      local_16f0._0_8_ = auVar1._0_8_;
      local_16f0._8_8_ = auVar1._8_8_;
      local_610 = 0x3f8000003f800000;
      uStack_608 = 0x3f8000003f800000;
      local_540 = local_16f0._0_8_;
      uStack_538 = local_16f0._8_8_;
      local_550 = 0x42b0c0a542b0c0a5;
      uStack_548 = 0x42b0c0a542b0c0a5;
      auVar21._8_8_ = 0x42b0c0a542b0c0a5;
      auVar21._0_8_ = 0x42b0c0a542b0c0a5;
      auVar1 = vminps_avx(auVar1,auVar21);
      local_5d0._0_8_ = auVar1._0_8_;
      local_570 = local_5d0._0_8_;
      local_5d0._8_8_ = auVar1._8_8_;
      uStack_568 = local_5d0._8_8_;
      local_580 = 0xc2b0c0a5c2b0c0a5;
      uStack_578 = 0xc2b0c0a5c2b0c0a5;
      auVar20._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar20._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar3 = vmaxps_avx(auVar1,auVar20);
      local_5d0._0_8_ = auVar3._0_8_;
      uVar8 = local_5d0._0_8_;
      local_5d0._8_8_ = auVar3._8_8_;
      uVar9 = local_5d0._8_8_;
      local_470 = 0x3fb8aa3b3fb8aa3b;
      uStack_468 = 0x3fb8aa3b3fb8aa3b;
      local_460._0_4_ = auVar3._0_4_;
      local_460._4_4_ = auVar3._4_4_;
      uStack_458._0_4_ = auVar3._8_4_;
      uStack_458._4_4_ = auVar3._12_4_;
      local_5f0._4_4_ = local_460._4_4_ * 1.442695;
      local_5f0._0_4_ = (float)local_460 * 1.442695;
      uStack_5e8._0_4_ = (float)uStack_458 * 1.442695;
      uStack_5e8._4_4_ = uStack_458._4_4_ * 1.442695;
      local_4e0 = local_5f0;
      uStack_4d8 = uStack_5e8;
      local_4f0 = 0x3f0000003f000000;
      uStack_4e8 = 0x3f0000003f000000;
      local_5f0._0_4_ = (float)local_460 * 1.442695 + 0.5;
      local_5f0._4_4_ = local_460._4_4_ * 1.442695 + 0.5;
      fVar30 = (float)uStack_458 * 1.442695 + 0.5;
      fVar34 = uStack_458._4_4_ * 1.442695 + 0.5;
      uStack_5e8._0_4_ = fVar30;
      uStack_5e8._4_4_ = fVar34;
      local_420 = local_5f0;
      uStack_418 = uStack_5e8;
      local_600._4_4_ = (int)(float)local_5f0._4_4_;
      local_600._0_4_ = (int)(float)local_5f0._0_4_;
      local_600._8_4_ = (int)fVar30;
      local_600._12_4_ = (int)fVar34;
      local_410 = local_600._0_8_;
      uStack_408 = local_600._8_8_;
      auVar22._8_8_ = local_600._8_8_;
      auVar22._0_8_ = local_600._0_8_;
      auVar2 = vcvtdq2ps_avx(auVar22);
      local_5e0 = auVar2._0_8_;
      local_3f0 = local_5e0;
      uStack_5d8 = auVar2._8_8_;
      uStack_3e8 = uStack_5d8;
      local_400 = local_5f0;
      uStack_3f8 = uStack_5e8;
      auVar23._8_8_ = uStack_5e8;
      auVar23._0_8_ = local_5f0;
      auVar1 = vcmpps_avx(auVar23,auVar2,1);
      local_620._0_8_ = auVar1._0_8_;
      local_3d0 = local_620._0_8_;
      local_620._8_8_ = auVar1._8_8_;
      uStack_3c8 = local_620._8_8_;
      local_3e0 = 0x3f8000003f800000;
      uStack_3d8 = 0x3f8000003f800000;
      auVar24._8_8_ = 0x3f8000003f800000;
      auVar24._0_8_ = 0x3f8000003f800000;
      local_620 = vpand_avx(auVar1,auVar24);
      local_520 = local_5e0;
      uStack_518 = uStack_5d8;
      local_530 = local_620._0_8_;
      uStack_528 = local_620._8_8_;
      _local_5f0 = vsubps_avx(auVar2,local_620);
      local_330 = local_5f0;
      uStack_328 = uStack_5e8;
      local_350 = local_5d0._0_8_;
      uStack_348 = local_5d0._8_8_;
      local_340 = 0x3f3180003f318000;
      uStack_338 = 0x3f3180003f318000;
      local_310 = local_5d0._0_8_;
      uStack_308 = local_5d0._8_8_;
      local_300 = 0x3f3180003f318000;
      uStack_2f8 = 0x3f3180003f318000;
      local_2f0._0_4_ = local_5f0._0_4_;
      local_2f0._4_4_ = local_5f0._4_4_;
      uStack_2e8._0_4_ = local_5f0._8_4_;
      uStack_2e8._4_4_ = local_5f0._12_4_;
      local_320 = (float)local_2f0 * 0.6933594;
      fStack_31c = local_2f0._4_4_ * 0.6933594;
      fStack_318 = (float)uStack_2e8 * 0.6933594;
      fStack_314 = uStack_2e8._4_4_ * 0.6933594;
      auVar26._4_4_ = fStack_31c;
      auVar26._0_4_ = local_320;
      auVar26._8_4_ = fStack_318;
      auVar26._12_4_ = fStack_314;
      auVar1 = vsubps_avx(auVar3,auVar26);
      local_3a0 = local_5f0;
      uStack_398 = uStack_5e8;
      local_5d0._0_8_ = auVar1._0_8_;
      local_3c0 = local_5d0._0_8_;
      local_5d0._8_8_ = auVar1._8_8_;
      uStack_3b8 = local_5d0._8_8_;
      local_3b0 = 0xb95e8083b95e8083;
      uStack_3a8 = 0xb95e8083b95e8083;
      local_380 = local_5d0._0_8_;
      uStack_378 = local_5d0._8_8_;
      local_360 = local_5f0;
      uStack_358 = uStack_5e8;
      local_370 = 0xb95e8083b95e8083;
      uStack_368 = 0xb95e8083b95e8083;
      local_390 = (float)local_2f0 * -0.00021219444;
      fStack_38c = local_2f0._4_4_ * -0.00021219444;
      fStack_388 = (float)uStack_2e8 * -0.00021219444;
      fStack_384 = uStack_2e8._4_4_ * -0.00021219444;
      auVar25._4_4_ = fStack_38c;
      auVar25._0_4_ = local_390;
      auVar25._8_4_ = fStack_388;
      auVar25._12_4_ = fStack_384;
      local_5d0 = vsubps_avx(auVar1,auVar25);
      local_490 = local_5d0._0_8_;
      uStack_488 = local_5d0._8_8_;
      local_480._0_4_ = local_5d0._0_4_;
      local_480._4_4_ = local_5d0._4_4_;
      uStack_478._0_4_ = local_5d0._8_4_;
      uStack_478._4_4_ = local_5d0._12_4_;
      local_5e0 = CONCAT44(local_480._4_4_ * local_480._4_4_,(float)local_480 * (float)local_480);
      uStack_5d8._0_4_ = (float)uStack_478 * (float)uStack_478;
      uStack_5d8._4_4_ = uStack_478._4_4_ * uStack_478._4_4_;
      local_90 = 0x3950696739506967;
      uStack_88 = 0x3950696739506967;
      local_a0 = local_5d0._0_8_;
      uStack_98 = local_5d0._8_8_;
      local_b0 = 0x3ab743ce3ab743ce;
      uStack_a8 = 0x3ab743ce3ab743ce;
      local_50 = 0x3950696739506967;
      uStack_48 = 0x3950696739506967;
      local_60 = local_5d0._0_8_;
      uStack_58 = local_5d0._8_8_;
      local_70 = (float)local_480 * 0.00019875691;
      fStack_6c = local_480._4_4_ * 0.00019875691;
      fStack_68 = (float)uStack_478 * 0.00019875691;
      fStack_64 = uStack_478._4_4_ * 0.00019875691;
      local_80 = 0x3ab743ce3ab743ce;
      uStack_78 = 0x3ab743ce3ab743ce;
      local_630 = CONCAT44(fStack_6c + 0.0013981999,local_70 + 0.0013981999);
      uStack_628 = CONCAT44(fStack_64 + 0.0013981999,fStack_68 + 0.0013981999);
      local_100 = local_630;
      uStack_f8 = uStack_628;
      local_110 = local_5d0._0_8_;
      uStack_108 = local_5d0._8_8_;
      local_120 = 0x3c0889083c088908;
      uStack_118 = 0x3c0889083c088908;
      local_c0 = local_630;
      uStack_b8 = uStack_628;
      local_d0 = local_5d0._0_8_;
      uStack_c8 = local_5d0._8_8_;
      local_e0 = (local_70 + 0.0013981999) * (float)local_480;
      fStack_dc = (fStack_6c + 0.0013981999) * local_480._4_4_;
      fStack_d8 = (fStack_68 + 0.0013981999) * (float)uStack_478;
      fStack_d4 = (fStack_64 + 0.0013981999) * uStack_478._4_4_;
      local_f0 = 0x3c0889083c088908;
      uStack_e8 = 0x3c0889083c088908;
      local_630 = CONCAT44(fStack_dc + 0.008333452,local_e0 + 0.008333452);
      uStack_628 = CONCAT44(fStack_d4 + 0.008333452,fStack_d8 + 0.008333452);
      local_170 = local_630;
      uStack_168 = uStack_628;
      local_180 = local_5d0._0_8_;
      uStack_178 = local_5d0._8_8_;
      local_190 = 0x3d2aa9c13d2aa9c1;
      uStack_188 = 0x3d2aa9c13d2aa9c1;
      local_130 = local_630;
      uStack_128 = uStack_628;
      local_140 = local_5d0._0_8_;
      uStack_138 = local_5d0._8_8_;
      local_150 = (local_e0 + 0.008333452) * (float)local_480;
      fStack_14c = (fStack_dc + 0.008333452) * local_480._4_4_;
      fStack_148 = (fStack_d8 + 0.008333452) * (float)uStack_478;
      fStack_144 = (fStack_d4 + 0.008333452) * uStack_478._4_4_;
      local_160 = 0x3d2aa9c13d2aa9c1;
      uStack_158 = 0x3d2aa9c13d2aa9c1;
      local_630 = CONCAT44(fStack_14c + 0.041665796,local_150 + 0.041665796);
      uStack_628 = CONCAT44(fStack_144 + 0.041665796,fStack_148 + 0.041665796);
      local_1e0 = local_630;
      uStack_1d8 = uStack_628;
      local_1f0 = local_5d0._0_8_;
      uStack_1e8 = local_5d0._8_8_;
      local_200 = 0x3e2aaaaa3e2aaaaa;
      uStack_1f8 = 0x3e2aaaaa3e2aaaaa;
      local_1a0 = local_630;
      uStack_198 = uStack_628;
      local_1b0 = local_5d0._0_8_;
      uStack_1a8 = local_5d0._8_8_;
      local_1c0 = (local_150 + 0.041665796) * (float)local_480;
      fStack_1bc = (fStack_14c + 0.041665796) * local_480._4_4_;
      fStack_1b8 = (fStack_148 + 0.041665796) * (float)uStack_478;
      fStack_1b4 = (fStack_144 + 0.041665796) * uStack_478._4_4_;
      local_1d0 = 0x3e2aaaaa3e2aaaaa;
      uStack_1c8 = 0x3e2aaaaa3e2aaaaa;
      local_630 = CONCAT44(fStack_1bc + 0.16666666,local_1c0 + 0.16666666);
      uStack_628 = CONCAT44(fStack_1b4 + 0.16666666,fStack_1b8 + 0.16666666);
      local_250 = local_630;
      uStack_248 = uStack_628;
      local_260 = local_5d0._0_8_;
      uStack_258 = local_5d0._8_8_;
      local_210 = local_630;
      uStack_208 = uStack_628;
      local_220 = local_5d0._0_8_;
      uStack_218 = local_5d0._8_8_;
      local_230 = (local_1c0 + 0.16666666) * (float)local_480;
      fStack_22c = (fStack_1bc + 0.16666666) * local_480._4_4_;
      fStack_228 = (fStack_1b8 + 0.16666666) * (float)uStack_478;
      fStack_224 = (fStack_1b4 + 0.16666666) * uStack_478._4_4_;
      local_240 = 0x3f0000003f000000;
      uStack_238 = 0x3f0000003f000000;
      local_630 = CONCAT44(fStack_22c + 0.5,local_230 + 0.5);
      uStack_628 = CONCAT44(fStack_224 + 0.5,fStack_228 + 0.5);
      local_2c0 = local_630;
      uStack_2b8 = uStack_628;
      local_2d0 = local_5e0;
      uStack_2c8 = uStack_5d8;
      local_2e0 = local_5d0._0_8_;
      uStack_2d8 = local_5d0._8_8_;
      local_280 = local_630;
      uStack_278 = uStack_628;
      local_290 = local_5e0;
      uStack_288 = uStack_5d8;
      local_2a0 = (local_230 + 0.5) * (float)local_480 * (float)local_480;
      fStack_29c = (fStack_22c + 0.5) * local_480._4_4_ * local_480._4_4_;
      fStack_298 = (fStack_228 + 0.5) * (float)uStack_478 * (float)uStack_478;
      fStack_294 = (fStack_224 + 0.5) * uStack_478._4_4_ * uStack_478._4_4_;
      local_2b0 = local_5d0._0_8_;
      uStack_2a8 = local_5d0._8_8_;
      local_630 = CONCAT44(fStack_29c + local_480._4_4_,local_2a0 + (float)local_480);
      uStack_628 = CONCAT44(fStack_294 + uStack_478._4_4_,fStack_298 + (float)uStack_478);
      local_500 = local_630;
      uStack_4f8 = uStack_628;
      local_510 = 0x3f8000003f800000;
      uStack_508 = 0x3f8000003f800000;
      fVar30 = local_2a0 + (float)local_480 + 1.0;
      fVar34 = fStack_29c + local_480._4_4_ + 1.0;
      fVar35 = fStack_298 + (float)uStack_478 + 1.0;
      fVar36 = fStack_294 + uStack_478._4_4_ + 1.0;
      local_630 = CONCAT44(fVar34,fVar30);
      uStack_628 = CONCAT44(fVar36,fVar35);
      local_430 = local_5f0;
      uStack_428 = uStack_5e8;
      local_600._4_4_ = (int)local_2f0._4_4_;
      local_600._0_4_ = (int)(float)local_2f0;
      local_600._8_4_ = (int)(float)uStack_2e8;
      local_600._12_4_ = (int)uStack_2e8._4_4_;
      local_5b0 = local_600._0_8_;
      uStack_5a8 = local_600._8_8_;
      local_5c0 = 0x7f0000007f;
      uStack_5b8 = 0x7f0000007f;
      auVar19._8_8_ = local_600._8_8_;
      auVar19._0_8_ = local_600._0_8_;
      auVar18._8_8_ = 0x7f0000007f;
      auVar18._0_8_ = 0x7f0000007f;
      auVar1 = vpaddd_avx(auVar19,auVar18);
      local_600._0_8_ = auVar1._0_8_;
      local_590 = local_600._0_8_;
      local_600._8_8_ = auVar1._8_8_;
      uStack_588 = local_600._8_8_;
      local_594 = 0x17;
      local_600 = vpslld_avx(auVar1,ZEXT416(0x17));
      local_40 = local_600._0_8_;
      uStack_38 = local_600._8_8_;
      local_640 = local_600._0_8_;
      uStack_638 = local_600._8_8_;
      local_4a0 = local_630;
      uStack_498 = uStack_628;
      local_4b0._0_4_ = local_600._0_4_;
      local_4b0._4_4_ = local_600._4_4_;
      uStack_4a8._0_4_ = local_600._8_4_;
      uStack_4a8._4_4_ = local_600._12_4_;
      local_630 = CONCAT44(fVar34 * local_4b0._4_4_,fVar30 * (float)local_4b0);
      uStack_628 = CONCAT44(fVar36 * uStack_4a8._4_4_,fVar35 * (float)uStack_4a8);
      local_650 = local_630;
      uStack_648 = uStack_628;
      local_1694 = 0x3f800000;
      local_16b0 = 0x3f800000;
      local_660 = 0x3f8000003f800000;
      uStack_658 = 0x3f8000003f800000;
      auVar2._8_8_ = uStack_628;
      auVar2._0_8_ = local_630;
      auVar1._8_8_ = 0x3f8000003f800000;
      auVar1._0_8_ = 0x3f8000003f800000;
      local_16f0 = vsubps_avx(auVar2,auVar1);
      local_450._0_4_ = local_16f0._0_4_;
      local_450._4_4_ = local_16f0._4_4_;
      uStack_448._0_4_ = local_16f0._8_4_;
      uStack_448._4_4_ = local_16f0._12_4_;
      local_4d0 = local_1730 * (float)local_450;
      fStack_4cc = local_1730 * local_450._4_4_;
      fStack_4c8 = local_1730 * (float)uStack_448;
      fStack_4c4 = local_1730 * uStack_448._4_4_;
      local_4c0._0_4_ = local_16e0._0_4_;
      local_4c0._4_4_ = local_16e0._4_4_;
      fStack_4b8 = local_16e0._8_4_;
      fStack_4b4 = local_16e0._12_4_;
      local_1710 = (float)local_4c0._0_4_ + local_4d0;
      fStack_170c = (float)local_4c0._4_4_ + fStack_4cc;
      fStack_1708 = fStack_4b8 + fStack_4c8;
      fStack_1704 = fStack_4b4 + fStack_4c4;
      *(ulong *)*local_1880 = CONCAT44(fStack_170c,local_1710);
      *(ulong *)(*local_1880 + 8) = CONCAT44(fStack_1704,fStack_1708);
      local_1880 = (undefined1 (*) [32])(*local_1880 + 0x10);
      local_16d0 = CONCAT44(local_1730,local_1730);
      uStack_16c8 = CONCAT44(local_1730,local_1730);
      uStack_16ac = local_16b0;
      uStack_16a8 = local_16b0;
      uStack_16a4 = local_16b0;
      local_6c0 = local_16c0;
      uStack_6b8 = uStack_16b8;
      local_690 = local_6a0;
      local_680 = local_16c0;
      uStack_678 = uStack_16b8;
      local_560 = local_6a0;
      _local_4c0 = local_16e0;
      local_4b0 = local_600._0_8_;
      uStack_4a8 = local_600._8_8_;
      local_480 = local_490;
      uStack_478 = uStack_488;
      local_460 = uVar8;
      uStack_458 = uVar9;
      local_450 = local_16f0._0_8_;
      uStack_448 = local_16f0._8_8_;
      local_440 = CONCAT44(local_1730,local_1730);
      uStack_438 = CONCAT44(local_1730,local_1730);
      local_2f0 = local_5f0;
      uStack_2e8 = uStack_5e8;
      local_270 = local_4f0;
      uStack_268 = uStack_4e8;
    }
    for (; local_18d8 < local_1874; local_18d8 = local_18d8 + 1) {
      if (*(float *)*local_1880 < 0.0) {
        fVar30 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        dVar31 = std::exp((double)(ulong)*(uint *)*local_1880);
        *(float *)*local_1880 = fVar30 * (SUB84(dVar31,0) - 1.0);
      }
      local_1880 = (undefined1 (*) [32])(*local_1880 + 4);
    }
  }
  return 0;
}

Assistant:

int ELU_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _alpha512 = _mm512_set1_ps(alpha);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _mm512_storeu_ps(ptr, elu_avx512(_p, _alpha512));

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _alpha256 = _mm256_set1_ps(alpha);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, elu_avx(_p, _alpha256));

            ptr += 8;
        }
#endif // __AVX__
        __m128 _alpha128 = _mm_set1_ps(alpha);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _mm_store_ps(ptr, elu_sse(_p, _alpha128));

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < 0.f)
                *ptr = static_cast<float>(alpha * (exp(*ptr) - 1.f));
            ptr++;
        }
    }

    return 0;
}